

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVaction INT_EVassoc_mutated_multi_action
                   (CManager_conflict cm,EVstone stone_id,EVaction act_num,EVMultiHandlerFunc func,
                   void *client_data,FMFormat *reference_formats,int_free_func free_func)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  action_class aVar5;
  int iVar6;
  stone_type p_Var7;
  response_cache_element *prVar8;
  undefined8 in_RCX;
  uint in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  long in_R9;
  char *tmp;
  response_cache_element *resp;
  int i;
  int queue_count;
  int resp_num;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffa8;
  stone_type in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar9;
  EVaction EVar10;
  
  uVar9 = 0;
  p_Var7 = stone_struct(in_stack_ffffffffffffffa8,0);
  EVar10 = p_Var7->response_cache_count;
  while (*(long *)(in_R9 + (long)(int)uVar9 * 8) != 0) {
    uVar9 = uVar9 + 1;
  }
  prVar8 = (response_cache_element *)
           INT_CMrealloc(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  p_Var7->response_cache = prVar8;
  iVar4 = CMtrace_val[10];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar4 = CMtrace_init((CManager)CONCAT44(in_ESI,in_EDX),(CMTraceType)((ulong)in_RCX >> 0x20));
  }
  if (iVar4 != 0) {
    fprintf(*(FILE **)(in_RDI + 0x120),
            "Installing %d mutated action responses for multi action %d on ",(ulong)uVar9,
            (ulong)in_EDX);
    fprint_stone_identifier
              ((FILE *)CONCAT44(EVar10,uVar9),
               (event_path_data)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    fprintf(*(FILE **)(in_RDI + 0x120),"\n");
  }
  for (iVar4 = 0; iVar4 < (int)uVar9; iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffffb0 =
         (stone_type)(p_Var7->response_cache + (p_Var7->response_cache_count + iVar4));
    in_stack_ffffffffffffffb0->is_processing = p_Var7->proto_actions[(int)in_EDX].action_type;
    in_stack_ffffffffffffffb0->is_draining = 1;
    in_stack_ffffffffffffffb0->is_outputting = in_EDX;
    *(undefined8 *)&in_stack_ffffffffffffffb0->is_stalled = in_RCX;
    in_stack_ffffffffffffffb0->queue_size = (int)in_R8;
    in_stack_ffffffffffffffb0->pending_output = (int)((ulong)in_R8 >> 0x20);
    *(response_cache_element **)&in_stack_ffffffffffffffb0->response_cache_count = resp;
    aVar5 = cached_stage_for_action((proto_action *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0->is_frozen = aVar5;
    lVar1 = *(long *)(in_R9 + (long)iVar4 * 8);
    in_stack_ffffffffffffffb0->local_id = (int)lVar1;
    in_stack_ffffffffffffffb0->default_action = (int)((ulong)lVar1 >> 0x20);
    iVar6 = CMtrace_val[10];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar6 = CMtrace_init((CManager)CONCAT44(in_ESI,in_EDX),(CMTraceType)((ulong)in_RCX >> 0x20));
    }
    if (iVar6 != 0) {
      lVar1._0_4_ = in_stack_ffffffffffffffb0->local_id;
      lVar1._4_4_ = in_stack_ffffffffffffffb0->default_action;
      if (lVar1 == 0) {
        in_stack_ffffffffffffffa8 = (event_path_data)strdup("<none>");
      }
      else {
        lVar2._0_4_ = in_stack_ffffffffffffffb0->local_id;
        lVar2._4_4_ = in_stack_ffffffffffffffb0->default_action;
        in_stack_ffffffffffffffa8 = (event_path_data)global_name_of_FMFormat(lVar2);
      }
      lVar3._0_4_ = in_stack_ffffffffffffffb0->local_id;
      lVar3._4_4_ = in_stack_ffffffffffffffb0->default_action;
      fprintf(*(FILE **)(in_RDI + 0x120),"\tResponse %d for format \"%s\"(%p)\n",
              (ulong)(uint)(p_Var7->response_cache_count + iVar4),in_stack_ffffffffffffffa8,lVar3);
      free(in_stack_ffffffffffffffa8);
    }
  }
  p_Var7->response_cache_count = uVar9 + p_Var7->response_cache_count;
  fix_response_cache(in_stack_ffffffffffffffb0);
  return EVar10;
}

Assistant:

extern EVaction
INT_EVassoc_mutated_multi_action(CManager cm, EVstone stone_id, EVaction act_num,
				  EVMultiHandlerFunc func, void *client_data, 
				 FMFormat *reference_formats, int_free_func free_func)
{
#ifdef HAVE_COD_H
    event_path_data evp = cm->evp;
    stone_type stone;
    int resp_num;
    int queue_count = 0, i;

    stone = stone_struct(evp, stone_id);
    resp_num = stone->response_cache_count;
    while (reference_formats[queue_count] != NULL) queue_count++;
    stone->response_cache = realloc(stone->response_cache, sizeof(stone->response_cache[0]) * (resp_num + queue_count));
    response_cache_element *resp;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Installing %d mutated action responses for multi action %d on ",
		queue_count, act_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_id);
	fprintf(cm->CMTrace_file, "\n");
    }
    for (i=0; i < queue_count; i++) {
	resp = &stone->response_cache[stone->response_cache_count + i];
	resp->action_type = stone->proto_actions[act_num].action_type;
	resp->requires_decoded = 1;
	resp->proto_action_id = act_num;
	resp->o.multi.handler = func;
	resp->o.multi.client_data = client_data;
	resp->o.multi.free_func = free_func;
        resp->stage = cached_stage_for_action(&stone->proto_actions[act_num]);
	resp->reference_format = reference_formats[i];
	if (CMtrace_on(cm, EVerbose)) {
	    char *tmp;
	    if (resp->reference_format) {
		tmp = global_name_of_FMFormat(resp->reference_format);
	    } else {
		tmp = strdup("<none>");
	    }
	    fprintf(cm->CMTrace_file, "\tResponse %d for format \"%s\"(%p)\n", stone->response_cache_count+i, tmp, resp->reference_format);
	    free(tmp);
	}
    }
    stone->response_cache_count += queue_count;
    fix_response_cache(stone);
    return resp_num;
#else
    fprintf(stderr, "No code generation in FFS, action unavailable\n");
    return -1;
#endif    
}